

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ArgumentListSyntax::ArgumentListSyntax
          (ArgumentListSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *parameters,Token closeParen)

{
  bool bVar1;
  size_t in_RDX;
  SyntaxNode *in_RSI;
  SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *in_RDI;
  pointer in_R8;
  size_t in_R9;
  ArgumentSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *in_stack_ffffffffffffffa0;
  
  SyntaxNode::SyntaxNode((SyntaxNode *)in_RDI,ArgumentList);
  (in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode = in_RSI;
  (in_RDI->super_SyntaxListBase).childCount = in_RDX;
  SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::SeparatedSyntaxList
            (in_stack_ffffffffffffffa0,in_RDI);
  in_RDI[1].elements._M_ptr = in_R8;
  in_RDI[1].elements._M_extent._M_extent_value = in_R9;
  in_RDI[1].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)in_RDI;
  SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)0x3ff836);
  SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::end(in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::iterator_base<slang::syntax::ArgumentSyntax_*>_>
                      ((self_type *)in_stack_ffffffffffffffa0,
                       (iterator_base<slang::syntax::ArgumentSyntax_*> *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffa0 =
         (SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::iterator_base<slang::syntax::ArgumentSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::iterator_base<slang::syntax::ArgumentSyntax_*>,_false>
                      *)0x3ff875);
    *(SeparatedSyntaxList<slang::syntax::ArgumentSyntax> **)
     &(in_stack_ffffffffffffffa0->super_SyntaxListBase).super_SyntaxNode = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::iterator_base<slang::syntax::ArgumentSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::iterator_base<slang::syntax::ArgumentSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::iterator_base<slang::syntax::ArgumentSyntax_*>,_false>
                *)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

ArgumentListSyntax(Token openParen, const SeparatedSyntaxList<ArgumentSyntax>& parameters, Token closeParen) :
        SyntaxNode(SyntaxKind::ArgumentList), openParen(openParen), parameters(parameters), closeParen(closeParen) {
        this->parameters.parent = this;
        for (auto child : this->parameters)
            child->parent = this;
    }